

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

_Bool ctl_init(tsd_t *tsd)

{
  uint uVar1;
  base_t *pbVar2;
  ctl_arena_t *pcVar3;
  _Bool _Var4;
  ulong i;
  
  malloc_mutex_lock((tsdn_t *)tsd,&ctl_mtx);
  if (ctl_initialized != '\0') {
LAB_01f8bbd5:
    _Var4 = false;
    goto LAB_01f8bbd7;
  }
  if (ctl_arenas == (ctl_arenas_t *)0x0) {
    pbVar2 = duckdb_je_b0get();
    ctl_arenas = (ctl_arenas_t *)duckdb_je_base_alloc((tsdn_t *)tsd,pbVar2,0x8020,0x10);
    if (ctl_arenas != (ctl_arenas_t *)0x0) goto LAB_01f8bc29;
LAB_01f8bd14:
    _Var4 = true;
  }
  else {
LAB_01f8bc29:
    if (ctl_stats == (ctl_stats_t *)0x0) {
      pbVar2 = duckdb_je_b0get();
      ctl_stats = (ctl_stats_t *)duckdb_je_base_alloc((tsdn_t *)tsd,pbVar2,0x2e0,0x10);
      if (ctl_stats == (ctl_stats_t *)0x0) goto LAB_01f8bd14;
    }
    pcVar3 = arenas_i_impl(tsd,0x1000,false,true);
    _Var4 = true;
    if (pcVar3 != (ctl_arena_t *)0x0) {
      pcVar3->initialized = true;
      pcVar3 = arenas_i_impl(tsd,0x1001,false,true);
      if (pcVar3 != (ctl_arena_t *)0x0) {
        pcVar3->nthreads = 0;
        pcVar3->dss = "N/A";
        *(undefined4 *)&pcVar3->dirty_decay_ms = 0xffffffff;
        *(undefined4 *)((long)&pcVar3->dirty_decay_ms + 4) = 0xffffffff;
        *(undefined4 *)&pcVar3->muzzy_decay_ms = 0xffffffff;
        *(undefined4 *)((long)&pcVar3->muzzy_decay_ms + 4) = 0xffffffff;
        pcVar3->pactive = 0;
        pcVar3->pdirty = 0;
        pcVar3->pmuzzy = 0;
        i = 0;
        switchD_016d8eb1::default(pcVar3->astats,0,0x9818);
        uVar1 = duckdb_je_narenas_total_get();
        ctl_arenas->narenas = uVar1;
        do {
          if (ctl_arenas->narenas <= i) {
            (ctl_arenas->destroyed).qlh_first = (ctl_arena_t *)0x0;
            ctl_refresh((tsdn_t *)tsd);
            ctl_initialized = '\x01';
            goto LAB_01f8bbd5;
          }
          pcVar3 = arenas_i_impl(tsd,i,false,true);
          i = i + 1;
        } while (pcVar3 != (ctl_arena_t *)0x0);
      }
    }
  }
LAB_01f8bbd7:
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  return _Var4;
}

Assistant:

static bool
ctl_init(tsd_t *tsd) {
	bool ret;
	tsdn_t *tsdn = tsd_tsdn(tsd);

	malloc_mutex_lock(tsdn, &ctl_mtx);
	if (!ctl_initialized) {
		ctl_arena_t *ctl_sarena, *ctl_darena;
		unsigned i;

		/*
		 * Allocate demand-zeroed space for pointers to the full
		 * range of supported arena indices.
		 */
		if (ctl_arenas == NULL) {
			ctl_arenas = (ctl_arenas_t *)base_alloc(tsdn,
			    b0get(), sizeof(ctl_arenas_t), QUANTUM);
			if (ctl_arenas == NULL) {
				ret = true;
				goto label_return;
			}
		}

		if (config_stats && ctl_stats == NULL) {
			ctl_stats = (ctl_stats_t *)base_alloc(tsdn, b0get(),
			    sizeof(ctl_stats_t), QUANTUM);
			if (ctl_stats == NULL) {
				ret = true;
				goto label_return;
			}
		}

		/*
		 * Allocate space for the current full range of arenas
		 * here rather than doing it lazily elsewhere, in order
		 * to limit when OOM-caused errors can occur.
		 */
		if ((ctl_sarena = arenas_i_impl(tsd, MALLCTL_ARENAS_ALL, false,
		    true)) == NULL) {
			ret = true;
			goto label_return;
		}
		ctl_sarena->initialized = true;

		if ((ctl_darena = arenas_i_impl(tsd, MALLCTL_ARENAS_DESTROYED,
		    false, true)) == NULL) {
			ret = true;
			goto label_return;
		}
		ctl_arena_clear(ctl_darena);
		/*
		 * Don't toggle ctl_darena to initialized until an arena is
		 * actually destroyed, so that arena.<i>.initialized can be used
		 * to query whether the stats are relevant.
		 */

		ctl_arenas->narenas = narenas_total_get();
		for (i = 0; i < ctl_arenas->narenas; i++) {
			if (arenas_i_impl(tsd, i, false, true) == NULL) {
				ret = true;
				goto label_return;
			}
		}

		ql_new(&ctl_arenas->destroyed);
		ctl_refresh(tsdn);

		ctl_initialized = true;
	}

	ret = false;
label_return:
	malloc_mutex_unlock(tsdn, &ctl_mtx);
	return ret;
}